

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

string * __thiscall
t_d_generator::render_package_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_program *program)

{
  string package;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"d",&local_51);
  t_program::get_namespace(&local_50,program,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_50._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_51);
  }
  else {
    std::operator+(__return_storage_ptr__,&local_50,".");
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string render_package(const t_program& program) const {
    string package = program.get_namespace("d");
    if (package.size() == 0)
      return "";
    return package + ".";
  }